

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

void __thiscall Js::JavascriptLibraryBase::Dispose(JavascriptLibraryBase *this,bool isShutdown)

{
  WriteBarrierPtr<Js::ScriptContext> local_20;
  
  if ((this->scriptContext).ptr != (ScriptContext *)0x0) {
    Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierPtr(&local_20,&this->scriptContext);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::ScriptContext>
              (&Memory::HeapAllocator::Instance,local_20.ptr);
    (this->scriptContext).ptr = (ScriptContext *)0x0;
  }
  return;
}

Assistant:

void JavascriptLibraryBase::Dispose(bool isShutdown)
    {
        if (scriptContext)
        {
            HeapDelete(scriptContext);
            scriptContext = nullptr;
        }
    }